

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void DC8uvNoTop_C(uint8_t *dst)

{
  int dc0;
  long lVar1;
  
  dc0 = 4;
  lVar1 = -1;
  do {
    dc0 = dc0 + (uint)dst[lVar1];
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0xff);
  lVar1 = 0;
  do {
    *(ulong *)(dst + lVar1) = (ulong)((uint)dc0 >> 3 & 0xff) * 0x101010101010101;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

static void DC8uvNoTop_C(uint8_t* dst) {  // DC with no top samples
  int dc0 = 4;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[-1 + i * BPS];
  }
  Put8x8uv(dc0 >> 3, dst);
}